

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  BVH *bvh;
  NodeRef root;
  float *pfVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  size_t k;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  int iVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [32];
  ulong uVar42;
  ulong uVar43;
  ulong *puVar44;
  ulong uVar45;
  long lVar46;
  undefined4 uVar47;
  ulong uVar48;
  bool bVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar67 [36];
  float fVar68;
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar70 [32];
  undefined1 auVar75 [36];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar107 [32];
  uint uVar103;
  uint uVar104;
  uint uVar109;
  uint uVar110;
  uint uVar111;
  float fVar112;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2ca1;
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [56];
  RayK<8> *local_2c48;
  undefined1 local_2c40 [40];
  undefined1 (*local_2c18) [32];
  RTCFilterFunctionNArguments local_2c10;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [8];
  undefined1 auStack_2bb8 [8];
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  float fStack_2ba4;
  undefined1 local_2ba0 [32];
  RayQueryContext *local_2b78;
  ulong local_2b70;
  Scene *local_2b68;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [8];
  float fStack_2b38;
  float fStack_2b34;
  float fStack_2b30;
  float fStack_2b2c;
  float fStack_2b28;
  float fStack_2b24;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [8];
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  undefined1 local_2ac0 [8];
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  float fStack_2aa4;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  undefined4 uStack_2a84;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  RTCHitN local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  uint local_2960;
  uint uStack_295c;
  uint uStack_2958;
  uint uStack_2954;
  uint uStack_2950;
  uint uStack_294c;
  uint uStack_2948;
  uint uStack_2944;
  uint local_2940;
  uint uStack_293c;
  uint uStack_2938;
  uint uStack_2934;
  uint uStack_2930;
  uint uStack_292c;
  uint uStack_2928;
  uint uStack_2924;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [32];
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  undefined1 local_28a0 [32];
  float local_2880;
  float fStack_287c;
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar66 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar54 = ZEXT816(0) << 0x40;
      auVar76 = vpcmpeqd_avx2(auVar66,(undefined1  [32])valid_i->field_0);
      auVar66 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar54),5);
      auVar55 = auVar76 & auVar66;
      if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar55 >> 0x7f,0) != '\0') ||
            (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar55 >> 0xbf,0) != '\0') ||
          (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar55[0x1f] < '\0') {
        auVar66 = vandps_avx(auVar66,auVar76);
        local_2840._0_4_ = *(undefined4 *)ray;
        local_2840._4_4_ = *(undefined4 *)(ray + 4);
        local_2840._8_4_ = *(undefined4 *)(ray + 8);
        local_2840._12_4_ = *(undefined4 *)(ray + 0xc);
        local_2840._16_4_ = *(undefined4 *)(ray + 0x10);
        local_2840._20_4_ = *(undefined4 *)(ray + 0x14);
        local_2840._24_4_ = *(undefined4 *)(ray + 0x18);
        local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_2840._32_4_ = *(undefined4 *)(ray + 0x20);
        local_2840._36_4_ = *(undefined4 *)(ray + 0x24);
        local_2840._40_4_ = *(undefined4 *)(ray + 0x28);
        local_2840._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_2840._48_4_ = *(undefined4 *)(ray + 0x30);
        local_2840._52_4_ = *(undefined4 *)(ray + 0x34);
        local_2840._56_4_ = *(undefined4 *)(ray + 0x38);
        local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_2840._64_4_ = *(undefined4 *)(ray + 0x40);
        local_2840._68_4_ = *(undefined4 *)(ray + 0x44);
        local_2840._72_4_ = *(undefined4 *)(ray + 0x48);
        local_2840._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_2840._80_4_ = *(undefined4 *)(ray + 0x50);
        local_2840._84_4_ = *(undefined4 *)(ray + 0x54);
        local_2840._88_4_ = *(undefined4 *)(ray + 0x58);
        local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_2a60._8_4_ = 0x7fffffff;
        local_2a60._0_8_ = 0x7fffffff7fffffff;
        local_2a60._12_4_ = 0x7fffffff;
        local_2a60._16_4_ = 0x7fffffff;
        local_2a60._20_4_ = 0x7fffffff;
        local_2a60._24_4_ = 0x7fffffff;
        local_2a60._28_4_ = 0x7fffffff;
        auVar105._8_4_ = 0x219392ef;
        auVar105._0_8_ = 0x219392ef219392ef;
        auVar105._12_4_ = 0x219392ef;
        auVar105._16_4_ = 0x219392ef;
        auVar105._20_4_ = 0x219392ef;
        auVar105._24_4_ = 0x219392ef;
        auVar105._28_4_ = 0x219392ef;
        auVar55 = vandps_avx(local_2a60,local_27e0);
        auVar55 = vcmpps_avx(auVar55,auVar105,1);
        auVar76 = vblendvps_avx(local_27e0,auVar105,auVar55);
        auVar55 = vandps_avx(local_2a60,local_27c0);
        auVar55 = vcmpps_avx(auVar55,auVar105,1);
        auVar77 = vblendvps_avx(local_27c0,auVar105,auVar55);
        auVar55 = vandps_avx(local_27a0,local_2a60);
        auVar55 = vcmpps_avx(auVar55,auVar105,1);
        auVar55 = vblendvps_avx(local_27a0,auVar105,auVar55);
        auVar6 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
        auVar66 = vrcpps_avx(auVar76);
        auVar106._8_4_ = 0x3f800000;
        auVar106._0_8_ = &DAT_3f8000003f800000;
        auVar106._12_4_ = 0x3f800000;
        auVar106._16_4_ = 0x3f800000;
        auVar106._20_4_ = 0x3f800000;
        auVar106._24_4_ = 0x3f800000;
        auVar106._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar76,auVar66,auVar106);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar66,auVar66);
        auVar66 = vrcpps_avx(auVar77);
        auVar14 = vfnmadd213ps_fma(auVar77,auVar66,auVar106);
        auVar76 = vrcpps_avx(auVar55);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar66,auVar66);
        auVar15 = vfnmadd213ps_fma(auVar55,auVar76,auVar106);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar76,auVar76);
        local_2780 = ZEXT1632(auVar13);
        local_2760 = ZEXT1632(auVar14);
        local_2740 = ZEXT1632(auVar15);
        local_2720 = auVar13._0_4_ * (float)local_2840._0_4_;
        fStack_271c = auVar13._4_4_ * (float)local_2840._4_4_;
        fStack_2718 = auVar13._8_4_ * (float)local_2840._8_4_;
        fStack_2714 = auVar13._12_4_ * (float)local_2840._12_4_;
        fStack_2710 = (float)local_2840._16_4_ * 0.0;
        fStack_270c = (float)local_2840._20_4_ * 0.0;
        fStack_2708 = (float)local_2840._24_4_ * 0.0;
        local_2700 = (float)local_2840._32_4_ * auVar14._0_4_;
        fStack_26fc = (float)local_2840._36_4_ * auVar14._4_4_;
        fStack_26f8 = (float)local_2840._40_4_ * auVar14._8_4_;
        fStack_26f4 = (float)local_2840._44_4_ * auVar14._12_4_;
        fStack_26f0 = (float)local_2840._48_4_ * 0.0;
        fStack_26ec = (float)local_2840._52_4_ * 0.0;
        fStack_26e8 = (float)local_2840._56_4_ * 0.0;
        local_26e0 = (float)local_2840._64_4_ * auVar15._0_4_;
        fStack_26dc = (float)local_2840._68_4_ * auVar15._4_4_;
        fStack_26d8 = (float)local_2840._72_4_ * auVar15._8_4_;
        fStack_26d4 = (float)local_2840._76_4_ * auVar15._12_4_;
        fStack_26d0 = (float)local_2840._80_4_ * 0.0;
        fStack_26cc = (float)local_2840._84_4_ * 0.0;
        fStack_26c8 = (float)local_2840._88_4_ * 0.0;
        auVar66 = vcmpps_avx(local_2780,ZEXT1632(auVar54),1);
        auVar76._8_4_ = 0x10;
        auVar76._0_8_ = 0x1000000010;
        auVar76._12_4_ = 0x10;
        auVar76._16_4_ = 0x10;
        auVar76._20_4_ = 0x10;
        auVar76._24_4_ = 0x10;
        auVar76._28_4_ = 0x10;
        local_26c0 = vandps_avx(auVar66,auVar76);
        auVar55 = ZEXT1632(auVar54);
        auVar66 = vcmpps_avx(ZEXT1632(auVar14),auVar55,5);
        auVar77._8_4_ = 0x20;
        auVar77._0_8_ = 0x2000000020;
        auVar77._12_4_ = 0x20;
        auVar77._16_4_ = 0x20;
        auVar77._20_4_ = 0x20;
        auVar77._24_4_ = 0x20;
        auVar77._28_4_ = 0x20;
        auVar83._8_4_ = 0x30;
        auVar83._0_8_ = 0x3000000030;
        auVar83._12_4_ = 0x30;
        auVar83._16_4_ = 0x30;
        auVar83._20_4_ = 0x30;
        auVar83._24_4_ = 0x30;
        auVar83._28_4_ = 0x30;
        local_26a0 = vblendvps_avx(auVar83,auVar77,auVar66);
        auVar66 = vcmpps_avx(ZEXT1632(auVar15),auVar55,5);
        auVar78._8_4_ = 0x40;
        auVar78._0_8_ = 0x4000000040;
        auVar78._12_4_ = 0x40;
        auVar78._16_4_ = 0x40;
        auVar78._20_4_ = 0x40;
        auVar78._24_4_ = 0x40;
        auVar78._28_4_ = 0x40;
        auVar84._8_4_ = 0x50;
        auVar84._0_8_ = 0x5000000050;
        auVar84._12_4_ = 0x50;
        auVar84._16_4_ = 0x50;
        auVar84._20_4_ = 0x50;
        auVar84._24_4_ = 0x50;
        auVar84._28_4_ = 0x50;
        local_2680 = vblendvps_avx(auVar84,auVar78,auVar66);
        auVar66 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar55);
        local_28e0 = vpmovsxwd_avx2(auVar6);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar102 = ZEXT3264(local_1e80);
        local_2660 = vblendvps_avx(local_1e80,auVar66,local_28e0);
        auVar66 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar55);
        auVar55._8_4_ = 0xff800000;
        auVar55._0_8_ = 0xff800000ff800000;
        auVar55._12_4_ = 0xff800000;
        auVar55._16_4_ = 0xff800000;
        auVar55._20_4_ = 0xff800000;
        auVar55._24_4_ = 0xff800000;
        auVar55._28_4_ = 0xff800000;
        local_2640 = vblendvps_avx(auVar55,auVar66,local_28e0);
        auVar54 = vpcmpeqd_avx(local_2640._0_16_,local_2640._0_16_);
        local_2b20 = vpmovsxwd_avx2(auVar6 ^ auVar54);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar48 = 5;
        }
        else {
          uVar48 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2c48 = ray + 0x100;
        puVar44 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar41 = (undefined1 (*) [32])local_1e40;
        local_2608 = (bvh->root).ptr;
        local_1e60 = local_2660;
        local_2900 = mm_lookupmask_ps._16_8_;
        uStack_28f8 = mm_lookupmask_ps._24_8_;
        uStack_28f0 = mm_lookupmask_ps._16_8_;
        uStack_28e8 = mm_lookupmask_ps._24_8_;
        local_2c18 = (undefined1 (*) [32])&local_2960;
        local_2920 = mm_lookupmask_pd._0_8_;
        uStack_2918 = mm_lookupmask_pd._8_8_;
        uStack_2910 = mm_lookupmask_pd._0_8_;
        uStack_2908 = mm_lookupmask_pd._8_8_;
        auVar66 = vpcmpeqd_avx2(auVar106,auVar106);
        auVar108 = ZEXT3264(auVar66);
        uStack_2704 = local_2840._28_4_;
        uStack_26e4 = local_2840._60_4_;
        uStack_26c4 = local_2840._92_4_;
LAB_005b4d58:
        pauVar41 = pauVar41 + -1;
        root.ptr = puVar44[-1];
        puVar44 = puVar44 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_005b5b77;
        local_2ca0 = *pauVar41;
        auVar66 = vcmpps_avx(local_2ca0,local_2640,1);
        if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar66 >> 0x7f,0) == '\0') &&
              (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar66 >> 0xbf,0) == '\0') &&
            (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar66[0x1f]) {
LAB_005b5b88:
          iVar39 = 2;
        }
        else {
          uVar47 = vmovmskps_avx(auVar66);
          uVar40 = CONCAT44((int)(uVar48 >> 0x20),uVar47);
          iVar39 = 0;
          if ((uint)POPCOUNT(uVar47) <= uVar48) {
            local_2c80._0_8_ = uVar48;
            while (uVar40 != 0) {
              k = 0;
              for (uVar48 = uVar40; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              local_2c40._0_8_ = k;
              auVar66 = ZEXT1632(auVar108._0_16_);
              local_2b78 = context;
              bVar49 = occluded1(This,bvh,root,k,&local_2ca1,ray,
                                 (TravRayK<8,_false> *)&local_2840.field_0,context);
              if (bVar49) {
                *(undefined4 *)(local_2b20 + local_2c40._0_8_ * 4) = 0xffffffff;
              }
              uVar40 = uVar40 - 1 & uVar40;
              auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar66 = vpcmpeqd_avx2(auVar66,auVar66);
              auVar108 = ZEXT3264(auVar66);
              context = local_2b78;
            }
            auVar66 = auVar108._0_32_ & ~local_2b20;
            iVar39 = 3;
            uVar48 = local_2c80._0_8_;
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0x7f,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0xbf,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar66[0x1f] < '\0') {
              auVar66._8_4_ = 0xff800000;
              auVar66._0_8_ = 0xff800000ff800000;
              auVar66._12_4_ = 0xff800000;
              auVar66._16_4_ = 0xff800000;
              auVar66._20_4_ = 0xff800000;
              auVar66._24_4_ = 0xff800000;
              auVar66._28_4_ = 0xff800000;
              local_2640 = vblendvps_avx(local_2640,auVar66,local_2b20);
              iVar39 = 2;
            }
          }
          if ((uint)uVar48 < (uint)POPCOUNT(uVar47)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_005b5b77;
                auVar66 = vcmpps_avx(local_2640,local_2ca0,6);
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0x7f,0) == '\0') &&
                      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0xbf,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar66[0x1f]) goto LAB_005b5b88;
                local_2b70 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar53 = local_2b20;
                if (local_2b70 == 0) goto LAB_005b5b39;
                local_2ca0._0_4_ = auVar108._0_4_ ^ local_2b20._0_4_;
                local_2ca0._4_4_ = auVar108._4_4_ ^ local_2b20._4_4_;
                local_2ca0._8_4_ = auVar108._8_4_ ^ local_2b20._8_4_;
                local_2ca0._12_4_ = auVar108._12_4_ ^ local_2b20._12_4_;
                local_2ca0._16_4_ = auVar108._16_4_ ^ local_2b20._16_4_;
                local_2ca0._20_4_ = auVar108._20_4_ ^ local_2b20._20_4_;
                local_2ca0._24_4_ = auVar108._24_4_ ^ local_2b20._24_4_;
                local_2ca0._28_4_ = auVar108._28_4_ ^ local_2b20._28_4_;
                lVar46 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar40 = 0;
                goto LAB_005b4f89;
              }
              auVar114 = ZEXT3264(auVar102._0_32_);
              uVar40 = 0;
              uVar45 = 8;
              do {
                uVar42 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar40 * 8);
                if (uVar42 != 8) {
                  uVar47 = *(undefined4 *)(root.ptr + 0x20 + uVar40 * 4);
                  auVar56._4_4_ = uVar47;
                  auVar56._0_4_ = uVar47;
                  auVar56._8_4_ = uVar47;
                  auVar56._12_4_ = uVar47;
                  auVar56._16_4_ = uVar47;
                  auVar56._20_4_ = uVar47;
                  auVar56._24_4_ = uVar47;
                  auVar56._28_4_ = uVar47;
                  auVar36._4_4_ = fStack_271c;
                  auVar36._0_4_ = local_2720;
                  auVar36._8_4_ = fStack_2718;
                  auVar36._12_4_ = fStack_2714;
                  auVar36._16_4_ = fStack_2710;
                  auVar36._20_4_ = fStack_270c;
                  auVar36._24_4_ = fStack_2708;
                  auVar36._28_4_ = uStack_2704;
                  uVar47 = *(undefined4 *)(root.ptr + 0x40 + uVar40 * 4);
                  auVar85._4_4_ = uVar47;
                  auVar85._0_4_ = uVar47;
                  auVar85._8_4_ = uVar47;
                  auVar85._12_4_ = uVar47;
                  auVar85._16_4_ = uVar47;
                  auVar85._20_4_ = uVar47;
                  auVar85._24_4_ = uVar47;
                  auVar85._28_4_ = uVar47;
                  auVar54 = vfmsub213ps_fma(auVar56,local_2780,auVar36);
                  auVar37._4_4_ = fStack_26fc;
                  auVar37._0_4_ = local_2700;
                  auVar37._8_4_ = fStack_26f8;
                  auVar37._12_4_ = fStack_26f4;
                  auVar37._16_4_ = fStack_26f0;
                  auVar37._20_4_ = fStack_26ec;
                  auVar37._24_4_ = fStack_26e8;
                  auVar37._28_4_ = uStack_26e4;
                  uVar47 = *(undefined4 *)(root.ptr + 0x60 + uVar40 * 4);
                  auVar90._4_4_ = uVar47;
                  auVar90._0_4_ = uVar47;
                  auVar90._8_4_ = uVar47;
                  auVar90._12_4_ = uVar47;
                  auVar90._16_4_ = uVar47;
                  auVar90._20_4_ = uVar47;
                  auVar90._24_4_ = uVar47;
                  auVar90._28_4_ = uVar47;
                  auVar6 = vfmsub213ps_fma(auVar85,local_2760,auVar37);
                  auVar38._4_4_ = fStack_26dc;
                  auVar38._0_4_ = local_26e0;
                  auVar38._8_4_ = fStack_26d8;
                  auVar38._12_4_ = fStack_26d4;
                  auVar38._16_4_ = fStack_26d0;
                  auVar38._20_4_ = fStack_26cc;
                  auVar38._24_4_ = fStack_26c8;
                  auVar38._28_4_ = uStack_26c4;
                  uVar47 = *(undefined4 *)(root.ptr + 0x30 + uVar40 * 4);
                  auVar98._4_4_ = uVar47;
                  auVar98._0_4_ = uVar47;
                  auVar98._8_4_ = uVar47;
                  auVar98._12_4_ = uVar47;
                  auVar98._16_4_ = uVar47;
                  auVar98._20_4_ = uVar47;
                  auVar98._24_4_ = uVar47;
                  auVar98._28_4_ = uVar47;
                  auVar13 = vfmsub213ps_fma(auVar90,local_2740,auVar38);
                  auVar14 = vfmsub213ps_fma(auVar98,local_2780,auVar36);
                  uVar47 = *(undefined4 *)(root.ptr + 0x50 + uVar40 * 4);
                  auVar79._4_4_ = uVar47;
                  auVar79._0_4_ = uVar47;
                  auVar79._8_4_ = uVar47;
                  auVar79._12_4_ = uVar47;
                  auVar79._16_4_ = uVar47;
                  auVar79._20_4_ = uVar47;
                  auVar79._24_4_ = uVar47;
                  auVar79._28_4_ = uVar47;
                  auVar15 = vfmsub213ps_fma(auVar79,local_2760,auVar37);
                  uVar47 = *(undefined4 *)(root.ptr + 0x70 + uVar40 * 4);
                  auVar62._4_4_ = uVar47;
                  auVar62._0_4_ = uVar47;
                  auVar62._8_4_ = uVar47;
                  auVar62._12_4_ = uVar47;
                  auVar62._16_4_ = uVar47;
                  auVar62._20_4_ = uVar47;
                  auVar62._24_4_ = uVar47;
                  auVar62._28_4_ = uVar47;
                  auVar10 = vfmsub213ps_fma(auVar62,local_2740,auVar38);
                  auVar66 = vpminsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar14));
                  auVar55 = vpminsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar15));
                  auVar66 = vpmaxsd_avx2(auVar66,auVar55);
                  auVar55 = vpminsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar10));
                  auVar55 = vpmaxsd_avx2(auVar66,auVar55);
                  auVar66 = vpmaxsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar14));
                  auVar76 = vpmaxsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar15));
                  auVar76 = vpminsd_avx2(auVar66,auVar76);
                  auVar66 = vpmaxsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar10));
                  auVar76 = vpminsd_avx2(auVar76,auVar66);
                  auVar66 = vpmaxsd_avx2(auVar55,local_2660);
                  auVar76 = vpminsd_avx2(auVar76,local_2640);
                  auVar66 = vcmpps_avx(auVar66,auVar76,2);
                  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar66 >> 0x7f,0) != '\0') ||
                        (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar66 >> 0xbf,0) != '\0') ||
                      (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar66[0x1f] < '\0') {
                    auVar66 = vblendvps_avx(auVar102._0_32_,auVar55,auVar66);
                    if (uVar45 != 8) {
                      *puVar44 = uVar45;
                      puVar44 = puVar44 + 1;
                      *pauVar41 = auVar114._0_32_;
                      pauVar41 = pauVar41 + 1;
                    }
                    auVar114 = ZEXT3264(auVar66);
                    uVar45 = uVar42;
                  }
                }
                local_2ca0 = auVar114._0_32_;
              } while ((uVar42 != 8) && (bVar49 = uVar40 < 3, uVar40 = uVar40 + 1, bVar49));
              iVar39 = 0;
              if (uVar45 == 8) {
LAB_005b4f2f:
                bVar49 = false;
                iVar39 = 4;
              }
              else {
                auVar66 = vcmpps_avx(local_2640,local_2ca0,6);
                uVar47 = vmovmskps_avx(auVar66);
                bVar49 = true;
                if ((uint)POPCOUNT(uVar47) <= (uint)uVar48) {
                  *puVar44 = uVar45;
                  puVar44 = puVar44 + 1;
                  *pauVar41 = local_2ca0;
                  pauVar41 = pauVar41 + 1;
                  goto LAB_005b4f2f;
                }
              }
              root.ptr = uVar45;
            } while (bVar49);
          }
        }
        goto LAB_005b5b7a;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar40 = uVar40 + 1;
    lVar46 = lVar46 + 0x60;
    if (local_2b70 <= uVar40) break;
LAB_005b4f89:
    auVar114 = ZEXT3264(local_2ca0);
    local_2b68 = context->scene;
    auVar116 = ZEXT3264(local_2ca0);
    uVar45 = 0;
    while( true ) {
      auVar55 = auVar114._0_32_;
      auVar66 = auVar116._0_32_;
      iVar39 = *(int *)(lVar46 + uVar45 * 4);
      if (iVar39 == -1) break;
      uVar104 = *(uint *)(lVar46 + -0x10 + uVar45 * 4);
      pfVar2 = (local_2b68->vertices).items[uVar104];
      uVar43 = (ulong)*(uint *)(lVar46 + -0x50 + uVar45 * 4);
      uVar42 = (ulong)*(uint *)(lVar46 + -0x40 + uVar45 * 4);
      fVar68 = pfVar2[uVar43];
      auVar86._4_4_ = fVar68;
      auVar86._0_4_ = fVar68;
      auVar86._8_4_ = fVar68;
      auVar86._12_4_ = fVar68;
      auVar86._16_4_ = fVar68;
      auVar86._20_4_ = fVar68;
      auVar86._24_4_ = fVar68;
      auVar86._28_4_ = fVar68;
      fVar71 = pfVar2[uVar43 + 1];
      auVar91._4_4_ = fVar71;
      auVar91._0_4_ = fVar71;
      auVar91._8_4_ = fVar71;
      auVar91._12_4_ = fVar71;
      auVar91._16_4_ = fVar71;
      auVar91._20_4_ = fVar71;
      auVar91._24_4_ = fVar71;
      auVar91._28_4_ = fVar71;
      fVar112 = pfVar2[uVar43 + 2];
      auVar96._4_4_ = fVar112;
      auVar96._0_4_ = fVar112;
      auVar96._8_4_ = fVar112;
      auVar96._12_4_ = fVar112;
      auVar96._16_4_ = fVar112;
      auVar96._20_4_ = fVar112;
      auVar96._24_4_ = fVar112;
      auVar96._28_4_ = fVar112;
      local_2bc0._4_4_ = pfVar2[uVar42];
      local_2b40._4_4_ = pfVar2[uVar42 + 1];
      local_2ac0._4_4_ = pfVar2[uVar42 + 2];
      uVar42 = (ulong)*(uint *)(lVar46 + -0x20 + uVar45 * 4);
      local_2ae0._4_4_ = pfVar2[uVar42];
      local_2860 = pfVar2[uVar42 + 1];
      local_2880 = pfVar2[uVar42 + 2];
      local_2bc0._0_4_ = local_2bc0._4_4_;
      auStack_2bb8._0_4_ = local_2bc0._4_4_;
      auStack_2bb8._4_4_ = local_2bc0._4_4_;
      fStack_2bb0 = (float)local_2bc0._4_4_;
      fStack_2bac = (float)local_2bc0._4_4_;
      fStack_2ba8 = (float)local_2bc0._4_4_;
      fStack_2ba4 = (float)local_2bc0._4_4_;
      fVar73 = fVar68 - (float)local_2bc0._4_4_;
      local_2c80._4_4_ = fVar73;
      local_2c80._0_4_ = fVar73;
      local_2c80._8_4_ = fVar73;
      local_2c80._12_4_ = fVar73;
      local_2c80._16_4_ = fVar73;
      local_2c80._20_4_ = fVar73;
      local_2c80._24_4_ = fVar73;
      local_2c80._28_4_ = fVar73;
      local_2b40._0_4_ = local_2b40._4_4_;
      fStack_2b38 = (float)local_2b40._4_4_;
      fStack_2b34 = (float)local_2b40._4_4_;
      fStack_2b30 = (float)local_2b40._4_4_;
      fStack_2b2c = (float)local_2b40._4_4_;
      fStack_2b28 = (float)local_2b40._4_4_;
      fStack_2b24 = (float)local_2b40._4_4_;
      fVar72 = fVar71 - (float)local_2b40._4_4_;
      local_2ac0._0_4_ = local_2ac0._4_4_;
      fStack_2ab8 = (float)local_2ac0._4_4_;
      fStack_2ab4 = (float)local_2ac0._4_4_;
      fStack_2ab0 = (float)local_2ac0._4_4_;
      fStack_2aac = (float)local_2ac0._4_4_;
      fStack_2aa8 = (float)local_2ac0._4_4_;
      fStack_2aa4 = (float)local_2ac0._4_4_;
      fVar74 = fVar112 - (float)local_2ac0._4_4_;
      auVar92._4_4_ = fVar74;
      auVar92._0_4_ = fVar74;
      auVar92._8_4_ = fVar74;
      auVar92._12_4_ = fVar74;
      auVar92._16_4_ = fVar74;
      auVar92._20_4_ = fVar74;
      auVar92._24_4_ = fVar74;
      auVar92._28_4_ = fVar74;
      local_2ae0._0_4_ = local_2ae0._4_4_;
      fStack_2ad8 = (float)local_2ae0._4_4_;
      fStack_2ad4 = (float)local_2ae0._4_4_;
      fStack_2ad0 = (float)local_2ae0._4_4_;
      fStack_2acc = (float)local_2ae0._4_4_;
      fStack_2ac8 = (float)local_2ae0._4_4_;
      fStack_2ac4 = (float)local_2ae0._4_4_;
      fVar68 = (float)local_2ae0._4_4_ - fVar68;
      auVar107._4_4_ = fVar68;
      auVar107._0_4_ = fVar68;
      auVar107._8_4_ = fVar68;
      auVar107._12_4_ = fVar68;
      auVar107._16_4_ = fVar68;
      auVar107._20_4_ = fVar68;
      auVar107._24_4_ = fVar68;
      auVar107._28_4_ = fVar68;
      fVar68 = fVar74 * fVar68;
      fVar71 = local_2860 - fVar71;
      fVar69 = fVar73 * fVar71;
      auVar113._4_4_ = fVar71;
      auVar113._0_4_ = fVar71;
      auVar113._8_4_ = fVar71;
      auVar113._12_4_ = fVar71;
      auVar113._16_4_ = fVar71;
      auVar113._20_4_ = fVar71;
      auVar113._24_4_ = fVar71;
      auVar113._28_4_ = fVar71;
      local_2b00._4_4_ = fVar72;
      local_2b00._0_4_ = fVar72;
      local_2b00._8_4_ = fVar72;
      local_2b00._12_4_ = fVar72;
      local_2b00._16_4_ = fVar72;
      local_2b00._20_4_ = fVar72;
      local_2b00._24_4_ = fVar72;
      local_2b00._28_4_ = fVar72;
      fVar71 = local_2880 - fVar112;
      fVar72 = fVar72 * fVar71;
      auVar115._4_4_ = fVar71;
      auVar115._0_4_ = fVar71;
      auVar115._8_4_ = fVar71;
      auVar115._12_4_ = fVar71;
      auVar115._16_4_ = fVar71;
      auVar115._20_4_ = fVar71;
      auVar115._24_4_ = fVar71;
      auVar115._28_4_ = fVar71;
      auVar50._4_4_ = fVar72;
      auVar50._0_4_ = fVar72;
      auVar50._8_4_ = fVar72;
      auVar50._12_4_ = fVar72;
      auVar50._16_4_ = fVar72;
      auVar50._20_4_ = fVar72;
      auVar50._24_4_ = fVar72;
      auVar50._28_4_ = fVar72;
      auVar13 = vfmsub231ps_fma(auVar50,auVar113,auVar92);
      auVar57._4_4_ = fVar68;
      auVar57._0_4_ = fVar68;
      auVar57._8_4_ = fVar68;
      auVar57._12_4_ = fVar68;
      auVar57._16_4_ = fVar68;
      auVar57._20_4_ = fVar68;
      auVar57._24_4_ = fVar68;
      auVar57._28_4_ = fVar68;
      auVar14 = vfmsub231ps_fma(auVar57,auVar115,local_2c80._0_32_);
      auVar63._4_4_ = fVar69;
      auVar63._0_4_ = fVar69;
      auVar63._8_4_ = fVar69;
      auVar63._12_4_ = fVar69;
      auVar63._16_4_ = fVar69;
      auVar63._20_4_ = fVar69;
      auVar63._24_4_ = fVar69;
      auVar63._28_4_ = fVar69;
      auVar15 = vfmsub231ps_fma(auVar63,auVar107,local_2b00);
      auVar67 = (undefined1  [36])0x0;
      auVar78 = vsubps_avx(auVar86,*(undefined1 (*) [32])ray);
      auVar83 = vsubps_avx(auVar91,*(undefined1 (*) [32])(ray + 0x20));
      auVar84 = vsubps_avx(auVar96,*(undefined1 (*) [32])(ray + 0x40));
      auVar55 = *(undefined1 (*) [32])(ray + 0x80);
      auVar76 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar7._4_4_ = auVar55._4_4_ * auVar83._4_4_;
      auVar7._0_4_ = auVar55._0_4_ * auVar83._0_4_;
      auVar7._8_4_ = auVar55._8_4_ * auVar83._8_4_;
      auVar7._12_4_ = auVar55._12_4_ * auVar83._12_4_;
      auVar7._16_4_ = auVar55._16_4_ * auVar83._16_4_;
      auVar7._20_4_ = auVar55._20_4_ * auVar83._20_4_;
      auVar7._24_4_ = auVar55._24_4_ * auVar83._24_4_;
      auVar7._28_4_ = fVar73;
      auVar10 = vfmsub231ps_fma(auVar7,auVar78,auVar76);
      auVar77 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar8._4_4_ = auVar15._4_4_ * auVar77._4_4_;
      auVar8._0_4_ = auVar15._0_4_ * auVar77._0_4_;
      auVar8._8_4_ = auVar15._8_4_ * auVar77._8_4_;
      auVar8._12_4_ = auVar15._12_4_ * auVar77._12_4_;
      auVar8._16_4_ = auVar77._16_4_ * 0.0;
      auVar8._20_4_ = auVar77._20_4_ * 0.0;
      auVar8._24_4_ = auVar77._24_4_ * 0.0;
      auVar8._28_4_ = fVar112;
      auVar54 = vfmadd231ps_fma(auVar8,ZEXT1632(auVar14),auVar76);
      auVar9._4_4_ = auVar84._4_4_ * auVar76._4_4_;
      auVar9._0_4_ = auVar84._0_4_ * auVar76._0_4_;
      auVar9._8_4_ = auVar84._8_4_ * auVar76._8_4_;
      auVar9._12_4_ = auVar84._12_4_ * auVar76._12_4_;
      auVar9._16_4_ = auVar84._16_4_ * auVar76._16_4_;
      auVar9._20_4_ = auVar84._20_4_ * auVar76._20_4_;
      auVar9._24_4_ = auVar84._24_4_ * auVar76._24_4_;
      auVar9._28_4_ = fVar74;
      auVar11 = vfmsub231ps_fma(auVar9,auVar83,auVar77);
      auVar64._4_4_ = auVar77._4_4_ * auVar78._4_4_;
      auVar64._0_4_ = auVar77._0_4_ * auVar78._0_4_;
      auVar64._8_4_ = auVar77._8_4_ * auVar78._8_4_;
      auVar64._12_4_ = auVar77._12_4_ * auVar78._12_4_;
      auVar64._16_4_ = auVar77._16_4_ * auVar78._16_4_;
      auVar64._20_4_ = auVar77._20_4_ * auVar78._20_4_;
      auVar64._24_4_ = auVar77._24_4_ * auVar78._24_4_;
      auVar64._28_4_ = auVar76._28_4_;
      auVar12 = vfmsub231ps_fma(auVar64,auVar84,auVar55);
      auVar75 = (undefined1  [36])0x0;
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar13),auVar55);
      auVar70._4_4_ = fVar71 * auVar10._4_4_;
      auVar70._0_4_ = fVar71 * auVar10._0_4_;
      auVar70._8_4_ = fVar71 * auVar10._8_4_;
      auVar70._12_4_ = fVar71 * auVar10._12_4_;
      auVar70._16_4_ = fVar71 * 0.0;
      auVar70._20_4_ = fVar71 * 0.0;
      auVar70._24_4_ = fVar71 * 0.0;
      auVar70._28_4_ = auVar77._28_4_;
      auVar116 = ZEXT3264(auVar66);
      auVar6 = vfmadd231ps_fma(auVar70,ZEXT1632(auVar12),auVar113);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar11),auVar107);
      uVar42 = (ulong)*(uint *)(lVar46 + -0x30 + uVar45 * 4);
      local_28a0._8_4_ = 0x80000000;
      local_28a0._0_8_ = 0x8000000080000000;
      local_28a0._12_4_ = 0x80000000;
      local_28a0._16_4_ = 0x80000000;
      local_28a0._20_4_ = 0x80000000;
      local_28a0._24_4_ = 0x80000000;
      local_28a0._28_4_ = 0x80000000;
      auVar55 = vandps_avx(ZEXT1632(auVar54),local_28a0);
      uVar103 = auVar55._0_4_;
      auVar99._0_4_ = (float)(uVar103 ^ auVar6._0_4_);
      uVar109 = auVar55._4_4_;
      auVar99._4_4_ = (float)(uVar109 ^ auVar6._4_4_);
      uVar110 = auVar55._8_4_;
      auVar99._8_4_ = (float)(uVar110 ^ auVar6._8_4_);
      uVar111 = auVar55._12_4_;
      auVar99._12_4_ = (float)(uVar111 ^ auVar6._12_4_);
      fVar112 = auVar55._16_4_;
      auVar99._16_4_ = fVar112;
      fVar69 = auVar55._20_4_;
      auVar99._20_4_ = fVar69;
      fVar72 = auVar55._24_4_;
      auVar99._24_4_ = fVar72;
      uVar47 = auVar55._28_4_;
      auVar99._28_4_ = uVar47;
      auVar76 = vcmpps_avx(auVar99,_DAT_02020f00,5);
      auVar77 = auVar66 & auVar76;
      fVar68 = pfVar2[uVar42];
      auVar80._4_4_ = fVar68;
      auVar80._0_4_ = fVar68;
      auVar80._8_4_ = fVar68;
      auVar80._12_4_ = fVar68;
      auVar80._16_4_ = fVar68;
      auVar80._20_4_ = fVar68;
      auVar80._24_4_ = fVar68;
      auVar80._28_4_ = fVar68;
      local_28c0 = pfVar2[uVar42 + 1];
      fVar71 = pfVar2[uVar42 + 2];
      local_2be0._4_4_ = fVar71;
      local_2be0._0_4_ = fVar71;
      local_2be0._8_4_ = fVar71;
      local_2be0._12_4_ = fVar71;
      local_2be0._16_4_ = fVar71;
      local_2be0._20_4_ = fVar71;
      local_2be0._24_4_ = fVar71;
      local_2be0._28_4_ = fVar71;
      local_2c40._0_32_ = auVar66;
      fStack_28bc = local_28c0;
      fStack_28b8 = local_28c0;
      fStack_28b4 = local_28c0;
      fStack_28b0 = local_28c0;
      fStack_28ac = local_28c0;
      fStack_28a8 = local_28c0;
      fStack_28a4 = local_28c0;
      fStack_287c = local_2880;
      fStack_2878 = local_2880;
      fStack_2874 = local_2880;
      fStack_2870 = local_2880;
      fStack_286c = local_2880;
      fStack_2868 = local_2880;
      fStack_2864 = local_2880;
      fStack_285c = local_2860;
      fStack_2858 = local_2860;
      fStack_2854 = local_2860;
      fStack_2850 = local_2860;
      fStack_284c = local_2860;
      fStack_2848 = local_2860;
      fStack_2844 = local_2860;
      auVar105 = local_2be0;
      if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar77 >> 0x7f,0) == '\0') &&
            (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar77 >> 0xbf,0) == '\0') &&
          (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar77[0x1f])
      {
        auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar66 = vpcmpeqd_avx2(auVar55,auVar55);
        auVar108 = ZEXT3264(auVar66);
        auVar114 = ZEXT3264(local_2ca0);
      }
      else {
        auVar76 = vandps_avx(auVar76,auVar66);
        auVar21._4_4_ = auVar10._4_4_ * fVar74;
        auVar21._0_4_ = auVar10._0_4_ * fVar74;
        auVar21._8_4_ = auVar10._8_4_ * fVar74;
        auVar21._12_4_ = auVar10._12_4_ * fVar74;
        auVar21._16_4_ = fVar74 * 0.0;
        auVar21._20_4_ = fVar74 * 0.0;
        auVar21._24_4_ = fVar74 * 0.0;
        auVar21._28_4_ = fVar68;
        auVar6 = vfmadd213ps_fma(local_2b00,ZEXT1632(auVar12),auVar21);
        auVar6 = vfmadd213ps_fma(local_2c80._0_32_,ZEXT1632(auVar11),ZEXT1632(auVar6));
        auVar75 = (undefined1  [36])0x0;
        auVar100._0_4_ = (float)(uVar103 ^ auVar6._0_4_);
        auVar100._4_4_ = (float)(uVar109 ^ auVar6._4_4_);
        auVar100._8_4_ = (float)(uVar110 ^ auVar6._8_4_);
        auVar100._12_4_ = (float)(uVar111 ^ auVar6._12_4_);
        auVar100._16_4_ = fVar112;
        auVar100._20_4_ = fVar69;
        auVar100._24_4_ = fVar72;
        auVar100._28_4_ = uVar47;
        auVar77 = vcmpps_avx(auVar100,_DAT_02020f00,5);
        auVar106 = auVar76 & auVar77;
        local_2b60 = auVar80;
        local_2a80 = auVar99;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar66 = vpcmpeqd_avx2(auVar55,auVar55);
          auVar108 = ZEXT3264(auVar66);
          auVar114 = ZEXT3264(local_2ca0);
        }
        else {
          local_2c80._0_8_ = uVar48;
          auVar105 = vandps_avx(ZEXT1632(auVar54),local_2a60);
          auVar75 = ZEXT436(auVar105._28_4_);
          auVar76 = vandps_avx(auVar76,auVar77);
          auVar77 = vsubps_avx(auVar105,auVar99);
          auVar77 = vcmpps_avx(auVar77,auVar100,5);
          auVar106 = auVar76 & auVar77;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar106 >> 0x7f,0) == '\0') &&
                (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0xbf,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar106[0x1f]) {
LAB_005b5485:
            auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
            auVar67 = (undefined1  [36])0x0;
          }
          else {
            auVar77 = vandps_avx(auVar77,auVar76);
            auVar22._4_4_ = auVar84._4_4_ * auVar15._4_4_;
            auVar22._0_4_ = auVar84._0_4_ * auVar15._0_4_;
            auVar22._8_4_ = auVar84._8_4_ * auVar15._8_4_;
            auVar22._12_4_ = auVar84._12_4_ * auVar15._12_4_;
            auVar22._16_4_ = auVar84._16_4_ * 0.0;
            auVar22._20_4_ = auVar84._20_4_ * 0.0;
            auVar22._24_4_ = auVar84._24_4_ * 0.0;
            auVar22._28_4_ = auVar76._28_4_;
            auVar6 = vfmadd213ps_fma(auVar83,ZEXT1632(auVar14),auVar22);
            auVar6 = vfmadd213ps_fma(auVar78,ZEXT1632(auVar13),ZEXT1632(auVar6));
            auVar82._0_4_ = (float)(uVar103 ^ auVar6._0_4_);
            auVar82._4_4_ = (float)(uVar109 ^ auVar6._4_4_);
            auVar82._8_4_ = (float)(uVar110 ^ auVar6._8_4_);
            auVar82._12_4_ = (float)(uVar111 ^ auVar6._12_4_);
            auVar82._16_4_ = fVar112;
            auVar82._20_4_ = fVar69;
            auVar82._24_4_ = fVar72;
            auVar82._28_4_ = uVar47;
            auVar88._0_4_ = auVar105._0_4_ * *(float *)(ray + 0x60);
            auVar88._4_4_ = auVar105._4_4_ * *(float *)(ray + 100);
            auVar88._8_4_ = auVar105._8_4_ * *(float *)(ray + 0x68);
            auVar88._12_4_ = auVar105._12_4_ * *(float *)(ray + 0x6c);
            auVar88._16_4_ = auVar105._16_4_ * *(float *)(ray + 0x70);
            auVar88._20_4_ = auVar105._20_4_ * *(float *)(ray + 0x74);
            auVar88._24_4_ = auVar105._24_4_ * *(float *)(ray + 0x78);
            auVar88._28_4_ = 0;
            auVar76 = vcmpps_avx(auVar88,auVar82,1);
            local_2aa0 = *(float *)(ray + 0x100);
            fStack_2a9c = *(float *)(ray + 0x104);
            fStack_2a98 = *(float *)(ray + 0x108);
            fStack_2a94 = *(float *)(ray + 0x10c);
            fStack_2a90 = *(float *)(ray + 0x110);
            fStack_2a8c = *(float *)(ray + 0x114);
            fStack_2a88 = *(float *)(ray + 0x118);
            uStack_2a84 = *(undefined4 *)(ray + 0x11c);
            auVar83 = *(undefined1 (*) [32])(ray + 0x100);
            auVar94._0_4_ = auVar105._0_4_ * local_2aa0;
            auVar94._4_4_ = auVar105._4_4_ * fStack_2a9c;
            auVar94._8_4_ = auVar105._8_4_ * fStack_2a98;
            auVar94._12_4_ = auVar105._12_4_ * fStack_2a94;
            auVar94._16_4_ = auVar105._16_4_ * fStack_2a90;
            auVar94._20_4_ = auVar105._20_4_ * fStack_2a8c;
            auVar94._24_4_ = auVar105._24_4_ * fStack_2a88;
            auVar94._28_4_ = 0;
            auVar78 = vcmpps_avx(auVar82,auVar94,2);
            auVar76 = vandps_avx(auVar78,auVar76);
            auVar78 = auVar77 & auVar76;
            if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar78 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar78 >> 0x7f,0) == '\0') &&
                  (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar78 >> 0xbf,0) == '\0') &&
                (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar78[0x1f]) goto LAB_005b5485;
            auVar76 = vandps_avx(auVar77,auVar76);
            auVar77 = vcmpps_avx(ZEXT1632(auVar54),_DAT_02020f00,4);
            auVar78 = auVar76 & auVar77;
            if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar78 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar78 >> 0x7f,0) == '\0') &&
                  (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar78 >> 0xbf,0) == '\0') &&
                (auVar78 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar78[0x1f]) goto LAB_005b5485;
            auVar76 = vandps_avx(auVar77,auVar76);
            pGVar3 = (context->scene->geometries).items[uVar104].ptr;
            local_2b00._0_8_ = pGVar3;
            uVar103 = pGVar3->mask;
            auVar95._4_4_ = uVar103;
            auVar95._0_4_ = uVar103;
            auVar95._8_4_ = uVar103;
            auVar95._12_4_ = uVar103;
            auVar95._16_4_ = uVar103;
            auVar95._20_4_ = uVar103;
            auVar95._24_4_ = uVar103;
            auVar95._28_4_ = uVar103;
            auVar77 = vpand_avx2(auVar95,*(undefined1 (*) [32])(ray + 0x120));
            auVar78 = vpcmpeqd_avx2(auVar77,_DAT_02020f00);
            auVar77 = auVar76 & ~auVar78;
            if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar77 >> 0x7f,0) == '\0') &&
                  (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar77 >> 0xbf,0) == '\0') &&
                (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar77[0x1f]) goto LAB_005b5485;
            auVar66 = vandnps_avx(auVar78,auVar76);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (auVar67 = (undefined1  [36])0x0, auVar75 = ZEXT436(auVar105._28_4_),
               pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar77 = vrcpps_avx(auVar105);
              auVar101._8_4_ = 0x3f800000;
              auVar101._0_8_ = &DAT_3f8000003f800000;
              auVar101._12_4_ = 0x3f800000;
              auVar101._16_4_ = 0x3f800000;
              auVar101._20_4_ = 0x3f800000;
              auVar101._24_4_ = 0x3f800000;
              auVar101._28_4_ = 0x3f800000;
              auVar54 = vfnmadd213ps_fma(auVar105,auVar77,auVar101);
              auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar77,auVar77);
              auVar75 = (undefined1  [36])0x0;
              fVar68 = auVar54._0_4_;
              fVar71 = auVar54._4_4_;
              auVar25._4_4_ = fVar71 * auVar99._4_4_;
              auVar25._0_4_ = fVar68 * auVar99._0_4_;
              fVar73 = auVar54._8_4_;
              auVar25._8_4_ = fVar73 * auVar99._8_4_;
              fVar74 = auVar54._12_4_;
              auVar25._12_4_ = fVar74 * auVar99._12_4_;
              auVar25._16_4_ = fVar112 * 0.0;
              auVar25._20_4_ = fVar69 * 0.0;
              auVar25._24_4_ = fVar72 * 0.0;
              auVar25._28_4_ = uStack_2a84;
              auVar76 = vminps_avx(auVar25,auVar101);
              auVar26._4_4_ = auVar100._4_4_ * fVar71;
              auVar26._0_4_ = auVar100._0_4_ * fVar68;
              auVar26._8_4_ = auVar100._8_4_ * fVar73;
              auVar26._12_4_ = auVar100._12_4_ * fVar74;
              auVar26._16_4_ = fVar112 * 0.0;
              auVar26._20_4_ = fVar69 * 0.0;
              auVar26._24_4_ = fVar72 * 0.0;
              auVar26._28_4_ = auVar77._28_4_;
              auVar77 = vminps_avx(auVar26,auVar101);
              auVar78 = vsubps_avx(auVar101,auVar76);
              auVar84 = vsubps_avx(auVar101,auVar77);
              auVar32._8_8_ = uStack_28f8;
              auVar32._0_8_ = local_2900;
              auVar32._16_8_ = uStack_28f0;
              auVar32._24_8_ = uStack_28e8;
              local_29e0 = vblendvps_avx(auVar76,auVar78,auVar32);
              local_29c0 = vblendvps_avx(auVar77,auVar84,auVar32);
              pRVar4 = context->user;
              local_2980._4_4_ = uVar104;
              local_2980._0_4_ = uVar104;
              local_2980._8_4_ = uVar104;
              local_2980._12_4_ = uVar104;
              local_2980._16_4_ = uVar104;
              local_2980._20_4_ = uVar104;
              local_2980._24_4_ = uVar104;
              local_2980._28_4_ = uVar104;
              local_29a0._4_4_ = iVar39;
              local_29a0._0_4_ = iVar39;
              local_29a0._8_4_ = iVar39;
              local_29a0._12_4_ = iVar39;
              local_29a0._16_4_ = iVar39;
              local_29a0._20_4_ = iVar39;
              local_29a0._24_4_ = iVar39;
              local_29a0._28_4_ = iVar39;
              local_2a40 = (RTCHitN  [32])ZEXT1632(auVar13);
              local_2a20 = ZEXT1632(auVar14);
              auVar76 = vpcmpeqd_avx2((undefined1  [32])local_2a40,(undefined1  [32])local_2a40);
              local_2c18[1] = auVar76;
              *local_2c18 = auVar76;
              local_2960 = pRVar4->instID[0];
              local_2940 = pRVar4->instPrimID[0];
              auVar58._0_4_ = fVar68 * auVar82._0_4_;
              auVar58._4_4_ = fVar71 * auVar82._4_4_;
              auVar58._8_4_ = fVar73 * auVar82._8_4_;
              auVar58._12_4_ = fVar74 * auVar82._12_4_;
              auVar58._16_4_ = fVar112 * 0.0;
              auVar58._20_4_ = fVar69 * 0.0;
              auVar58._24_4_ = fVar72 * 0.0;
              auVar58._28_4_ = 0;
              auVar76 = vblendvps_avx(auVar83,auVar58,auVar66);
              *(undefined1 (*) [32])(ray + 0x100) = auVar76;
              local_2c10.valid = (int *)local_2ba0;
              local_2c10.geometryUserPtr = pGVar3->userPtr;
              local_2c10.context = context->user;
              local_2c10.hit = local_2a40;
              local_2c10.N = 8;
              local_2c10.ray = (RTCRayN *)ray;
              local_2ba0 = auVar66;
              local_2a00 = ZEXT1632(auVar15);
              uStack_295c = local_2960;
              uStack_2958 = local_2960;
              uStack_2954 = local_2960;
              uStack_2950 = local_2960;
              uStack_294c = local_2960;
              uStack_2948 = local_2960;
              uStack_2944 = local_2960;
              uStack_293c = local_2940;
              uStack_2938 = local_2940;
              uStack_2934 = local_2940;
              uStack_2930 = local_2940;
              uStack_292c = local_2940;
              uStack_2928 = local_2940;
              uStack_2924 = local_2940;
              auVar67 = (undefined1  [36])0x0;
              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar67 = (undefined1  [36])0x0;
                auVar75 = (undefined1  [36])0x0;
                auVar55 = ZEXT1632(auVar55._0_16_);
                (*pGVar3->occlusionFilterN)(&local_2c10);
              }
              auVar66 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2ba0);
              auVar76 = _DAT_0205a980 & ~auVar66;
              if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar76 >> 0x7f,0) == '\0') &&
                    (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar76 >> 0xbf,0) == '\0') &&
                  (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar76[0x1f]) {
                auVar66 = auVar66 ^ _DAT_0205a980;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    ((*(byte *)(local_2b00._0_8_ + 0x3e) & 0x40) != 0)))) {
                  auVar67 = (undefined1  [36])0x0;
                  auVar75 = (undefined1  [36])0x0;
                  auVar55 = ZEXT1632(auVar55._0_16_);
                  (*p_Var5)(&local_2c10);
                }
                auVar76 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2ba0);
                auVar66 = auVar76 ^ _DAT_0205a980;
                auVar59._8_4_ = 0xff800000;
                auVar59._0_8_ = 0xff800000ff800000;
                auVar59._12_4_ = 0xff800000;
                auVar59._16_4_ = 0xff800000;
                auVar59._20_4_ = 0xff800000;
                auVar59._24_4_ = 0xff800000;
                auVar59._28_4_ = 0xff800000;
                auVar76 = vblendvps_avx(auVar59,*(undefined1 (*) [32])(local_2c10.ray + 0x100),
                                        auVar76);
                *(undefined1 (*) [32])(local_2c10.ray + 0x100) = auVar76;
              }
              auVar30._4_4_ = fStack_2a9c;
              auVar30._0_4_ = local_2aa0;
              auVar30._8_4_ = fStack_2a98;
              auVar30._12_4_ = fStack_2a94;
              auVar30._16_4_ = fStack_2a90;
              auVar30._20_4_ = fStack_2a8c;
              auVar30._24_4_ = fStack_2a88;
              auVar30._28_4_ = uStack_2a84;
              auVar76 = vblendvps_avx(auVar30,*(undefined1 (*) [32])local_2c48,auVar66);
              *(undefined1 (*) [32])local_2c48 = auVar76;
            }
            auVar66 = vandnps_avx(auVar66,local_2c40._0_32_);
            auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
            uVar48 = local_2c80._0_8_;
          }
          auVar116 = ZEXT3264(auVar66);
          auVar108 = ZEXT3264(auVar55);
          auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar114 = ZEXT3264(local_2ca0);
          auVar92 = local_2be0;
          auVar80 = local_2b60;
          auVar105 = local_2be0;
        }
      }
      local_2be0 = auVar92;
      auVar66 = auVar116._0_32_;
      if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar66 >> 0x7f,0) == '\0') &&
            (auVar116 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar66 >> 0xbf,0) == '\0') &&
          (auVar116 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar116[0x1f]) {
        bVar49 = false;
      }
      else {
        auVar78 = vsubps_avx(auVar80,_local_2ae0);
        auVar33._4_4_ = fStack_28bc;
        auVar33._0_4_ = local_28c0;
        auVar33._8_4_ = fStack_28b8;
        auVar33._12_4_ = fStack_28b4;
        auVar33._16_4_ = fStack_28b0;
        auVar33._20_4_ = fStack_28ac;
        auVar33._24_4_ = fStack_28a8;
        auVar33._28_4_ = fStack_28a4;
        auVar35._4_4_ = fStack_285c;
        auVar35._0_4_ = local_2860;
        auVar35._8_4_ = fStack_2858;
        auVar35._12_4_ = fStack_2854;
        auVar35._16_4_ = fStack_2850;
        auVar35._20_4_ = fStack_284c;
        auVar35._24_4_ = fStack_2848;
        auVar35._28_4_ = fStack_2844;
        auVar83 = vsubps_avx(auVar33,auVar35);
        auVar34._4_4_ = fStack_287c;
        auVar34._0_4_ = local_2880;
        auVar34._8_4_ = fStack_2878;
        auVar34._12_4_ = fStack_2874;
        auVar34._16_4_ = fStack_2870;
        auVar34._20_4_ = fStack_286c;
        auVar34._24_4_ = fStack_2868;
        auVar34._28_4_ = fStack_2864;
        auVar84 = vsubps_avx(auVar105,auVar34);
        auVar106 = vsubps_avx(_local_2bc0,auVar80);
        auVar53 = vsubps_avx(_local_2b40,auVar33);
        auVar7 = vsubps_avx(_local_2ac0,auVar105);
        auVar102._0_4_ = auVar83._0_4_ * auVar7._0_4_;
        auVar102._4_4_ = auVar83._4_4_ * auVar7._4_4_;
        auVar102._8_4_ = auVar83._8_4_ * auVar7._8_4_;
        auVar102._12_4_ = auVar83._12_4_ * auVar7._12_4_;
        auVar102._16_4_ = auVar83._16_4_ * auVar7._16_4_;
        auVar102._20_4_ = auVar83._20_4_ * auVar7._20_4_;
        auVar102._24_4_ = auVar83._24_4_ * auVar7._24_4_;
        auVar102._28_36_ = auVar67;
        auVar6 = vfmsub231ps_fma(auVar102._0_32_,auVar53,auVar84);
        auVar108._0_4_ = auVar84._0_4_ * auVar106._0_4_;
        auVar108._4_4_ = auVar84._4_4_ * auVar106._4_4_;
        auVar108._8_4_ = auVar84._8_4_ * auVar106._8_4_;
        auVar108._12_4_ = auVar84._12_4_ * auVar106._12_4_;
        auVar108._16_4_ = auVar84._16_4_ * auVar106._16_4_;
        auVar108._20_4_ = auVar84._20_4_ * auVar106._20_4_;
        auVar108._24_4_ = auVar84._24_4_ * auVar106._24_4_;
        auVar108._28_36_ = auVar75;
        auVar13 = vfmsub231ps_fma(auVar108._0_32_,auVar7,auVar78);
        auVar16._4_4_ = auVar53._4_4_ * auVar78._4_4_;
        auVar16._0_4_ = auVar53._0_4_ * auVar78._0_4_;
        auVar16._8_4_ = auVar53._8_4_ * auVar78._8_4_;
        auVar16._12_4_ = auVar53._12_4_ * auVar78._12_4_;
        auVar16._16_4_ = auVar53._16_4_ * auVar78._16_4_;
        auVar16._20_4_ = auVar53._20_4_ * auVar78._20_4_;
        auVar16._24_4_ = auVar53._24_4_ * auVar78._24_4_;
        auVar16._28_4_ = auVar78._28_4_;
        auVar8 = vsubps_avx(auVar80,*(undefined1 (*) [32])ray);
        auVar9 = vsubps_avx(auVar33,*(undefined1 (*) [32])(ray + 0x20));
        auVar105 = vsubps_avx(auVar105,*(undefined1 (*) [32])(ray + 0x40));
        auVar14 = vfmsub231ps_fma(auVar16,auVar106,auVar83);
        auVar55 = *(undefined1 (*) [32])(ray + 0x80);
        auVar76 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar114._0_4_ = auVar55._0_4_ * auVar9._0_4_;
        auVar114._4_4_ = auVar55._4_4_ * auVar9._4_4_;
        auVar114._8_4_ = auVar55._8_4_ * auVar9._8_4_;
        auVar114._12_4_ = auVar55._12_4_ * auVar9._12_4_;
        auVar114._16_4_ = auVar55._16_4_ * auVar9._16_4_;
        auVar114._20_4_ = auVar55._20_4_ * auVar9._20_4_;
        auVar114._28_36_ = auVar116._28_36_;
        auVar114._24_4_ = auVar55._24_4_ * auVar9._24_4_;
        auVar15 = vfmsub231ps_fma(auVar114._0_32_,auVar8,auVar76);
        auVar77 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar92 = ZEXT1632(auVar14);
        auVar17._4_4_ = auVar77._4_4_ * auVar14._4_4_;
        auVar17._0_4_ = auVar77._0_4_ * auVar14._0_4_;
        auVar17._8_4_ = auVar77._8_4_ * auVar14._8_4_;
        auVar17._12_4_ = auVar77._12_4_ * auVar14._12_4_;
        auVar17._16_4_ = auVar77._16_4_ * 0.0;
        auVar17._20_4_ = auVar77._20_4_ * 0.0;
        auVar17._24_4_ = auVar77._24_4_ * 0.0;
        auVar17._28_4_ = auVar83._28_4_;
        auVar70 = ZEXT1632(auVar13);
        auVar54 = vfmadd231ps_fma(auVar17,auVar70,auVar76);
        auVar18._4_4_ = auVar76._4_4_ * auVar105._4_4_;
        auVar18._0_4_ = auVar76._0_4_ * auVar105._0_4_;
        auVar18._8_4_ = auVar76._8_4_ * auVar105._8_4_;
        auVar18._12_4_ = auVar76._12_4_ * auVar105._12_4_;
        auVar18._16_4_ = auVar76._16_4_ * auVar105._16_4_;
        auVar18._20_4_ = auVar76._20_4_ * auVar105._20_4_;
        auVar18._24_4_ = auVar76._24_4_ * auVar105._24_4_;
        auVar18._28_4_ = auVar76._28_4_;
        auVar10 = vfmsub231ps_fma(auVar18,auVar9,auVar77);
        auVar19._4_4_ = auVar77._4_4_ * auVar8._4_4_;
        auVar19._0_4_ = auVar77._0_4_ * auVar8._0_4_;
        auVar19._8_4_ = auVar77._8_4_ * auVar8._8_4_;
        auVar19._12_4_ = auVar77._12_4_ * auVar8._12_4_;
        auVar19._16_4_ = auVar77._16_4_ * auVar8._16_4_;
        auVar19._20_4_ = auVar77._20_4_ * auVar8._20_4_;
        auVar19._24_4_ = auVar77._24_4_ * auVar8._24_4_;
        auVar19._28_4_ = auVar77._28_4_;
        auVar11 = vfmsub231ps_fma(auVar19,auVar105,auVar55);
        auVar64 = ZEXT1632(auVar6);
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar64,auVar55);
        auVar20._4_4_ = auVar7._4_4_ * auVar15._4_4_;
        auVar20._0_4_ = auVar7._0_4_ * auVar15._0_4_;
        auVar20._8_4_ = auVar7._8_4_ * auVar15._8_4_;
        auVar20._12_4_ = auVar7._12_4_ * auVar15._12_4_;
        auVar20._16_4_ = auVar7._16_4_ * 0.0;
        auVar20._20_4_ = auVar7._20_4_ * 0.0;
        auVar20._24_4_ = auVar7._24_4_ * 0.0;
        auVar20._28_4_ = auVar55._28_4_;
        auVar6 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar11),auVar53);
        auVar55 = vandps_avx(ZEXT1632(auVar54),local_28a0);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar10),auVar106);
        uVar104 = auVar55._0_4_;
        auVar81._0_4_ = (float)(uVar104 ^ auVar6._0_4_);
        uVar103 = auVar55._4_4_;
        auVar81._4_4_ = (float)(uVar103 ^ auVar6._4_4_);
        uVar109 = auVar55._8_4_;
        auVar81._8_4_ = (float)(uVar109 ^ auVar6._8_4_);
        uVar110 = auVar55._12_4_;
        auVar81._12_4_ = (float)(uVar110 ^ auVar6._12_4_);
        fVar68 = auVar55._16_4_;
        auVar81._16_4_ = fVar68;
        fVar71 = auVar55._20_4_;
        auVar81._20_4_ = fVar71;
        fVar112 = auVar55._24_4_;
        auVar81._24_4_ = fVar112;
        uVar47 = auVar55._28_4_;
        auVar81._28_4_ = uVar47;
        auVar76 = vcmpps_avx(auVar81,_DAT_02020f00,5);
        auVar77 = auVar66 & auVar76;
        local_2c40._0_32_ = auVar66;
        _local_2bc0 = auVar78;
        _local_2b40 = auVar83;
        if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar77 >> 0x7f,0) == '\0') &&
              (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar77 >> 0xbf,0) == '\0') &&
            (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar77[0x1f]) {
LAB_005b52c7:
          auVar66 = vpcmpeqd_avx2(auVar55,auVar55);
        }
        else {
          auVar66 = vandps_avx(auVar76,auVar66);
          auVar51._0_4_ = auVar84._0_4_ * auVar15._0_4_;
          auVar51._4_4_ = auVar84._4_4_ * auVar15._4_4_;
          auVar51._8_4_ = auVar84._8_4_ * auVar15._8_4_;
          auVar51._12_4_ = auVar84._12_4_ * auVar15._12_4_;
          auVar51._16_4_ = auVar84._16_4_ * 0.0;
          auVar51._20_4_ = auVar84._20_4_ * 0.0;
          auVar51._24_4_ = auVar84._24_4_ * 0.0;
          auVar51._28_4_ = 0;
          auVar6 = vfmadd213ps_fma(auVar83,ZEXT1632(auVar11),auVar51);
          auVar6 = vfmadd213ps_fma(auVar78,ZEXT1632(auVar10),ZEXT1632(auVar6));
          auVar93._0_4_ = (float)(uVar104 ^ auVar6._0_4_);
          auVar93._4_4_ = (float)(uVar103 ^ auVar6._4_4_);
          auVar93._8_4_ = (float)(uVar109 ^ auVar6._8_4_);
          auVar93._12_4_ = (float)(uVar110 ^ auVar6._12_4_);
          auVar93._16_4_ = fVar68;
          auVar93._20_4_ = fVar71;
          auVar93._24_4_ = fVar112;
          auVar93._28_4_ = uVar47;
          auVar76 = vcmpps_avx(auVar93,_DAT_02020f00,5);
          auVar77 = auVar66 & auVar76;
          _local_2ae0 = auVar92;
          _local_2ac0 = auVar70;
          if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar77 >> 0x7f,0) == '\0') &&
                (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar77 >> 0xbf,0) == '\0') &&
              (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar77[0x1f]) goto LAB_005b52c7;
          local_2c80._0_8_ = uVar48;
          auVar77 = vandps_avx(ZEXT1632(auVar54),local_2a60);
          auVar66 = vandps_avx(auVar76,auVar66);
          auVar83 = vsubps_avx(auVar77,auVar81);
          auVar76 = vcmpps_avx(auVar83,auVar93,5);
          auVar84 = auVar66 & auVar76;
          if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar84 >> 0x7f,0) != '\0') ||
                (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar84 >> 0xbf,0) != '\0') ||
              (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar84[0x1f] < '\0') {
            auVar66 = vandps_avx(auVar76,auVar66);
            auVar23._4_4_ = auVar105._4_4_ * auVar14._4_4_;
            auVar23._0_4_ = auVar105._0_4_ * auVar14._0_4_;
            auVar23._8_4_ = auVar105._8_4_ * auVar14._8_4_;
            auVar23._12_4_ = auVar105._12_4_ * auVar14._12_4_;
            auVar23._16_4_ = auVar105._16_4_ * 0.0;
            auVar23._20_4_ = auVar105._20_4_ * 0.0;
            auVar23._24_4_ = auVar105._24_4_ * 0.0;
            auVar23._28_4_ = auVar83._28_4_;
            auVar6 = vfmadd132ps_fma(auVar9,auVar23,auVar70);
            auVar6 = vfmadd213ps_fma(auVar8,auVar64,ZEXT1632(auVar6));
            auVar87._0_4_ = (float)(uVar104 ^ auVar6._0_4_);
            auVar87._4_4_ = (float)(uVar103 ^ auVar6._4_4_);
            auVar87._8_4_ = (float)(uVar109 ^ auVar6._8_4_);
            auVar87._12_4_ = (float)(uVar110 ^ auVar6._12_4_);
            auVar87._16_4_ = fVar68;
            auVar87._20_4_ = fVar71;
            auVar87._24_4_ = fVar112;
            auVar87._28_4_ = uVar47;
            auVar24._4_4_ = auVar77._4_4_ * *(float *)(ray + 100);
            auVar24._0_4_ = auVar77._0_4_ * *(float *)(ray + 0x60);
            auVar24._8_4_ = auVar77._8_4_ * *(float *)(ray + 0x68);
            auVar24._12_4_ = auVar77._12_4_ * *(float *)(ray + 0x6c);
            auVar24._16_4_ = auVar77._16_4_ * *(float *)(ray + 0x70);
            auVar24._20_4_ = auVar77._20_4_ * *(float *)(ray + 0x74);
            auVar24._24_4_ = auVar77._24_4_ * *(float *)(ray + 0x78);
            auVar24._28_4_ = auVar83._28_4_;
            auVar76 = vcmpps_avx(auVar24,auVar87,1);
            _local_2b40 = *(undefined1 (*) [32])(ray + 0x100);
            auVar89._0_4_ = auVar77._0_4_ * local_2b40._0_4_;
            auVar89._4_4_ = auVar77._4_4_ * local_2b40._4_4_;
            auVar89._8_4_ = auVar77._8_4_ * local_2b40._8_4_;
            auVar89._12_4_ = auVar77._12_4_ * local_2b40._12_4_;
            auVar89._16_4_ = auVar77._16_4_ * local_2b40._16_4_;
            auVar89._20_4_ = auVar77._20_4_ * local_2b40._20_4_;
            auVar89._24_4_ = auVar77._24_4_ * local_2b40._24_4_;
            auVar89._28_4_ = 0;
            auVar83 = vcmpps_avx(auVar87,auVar89,2);
            auVar76 = vandps_avx(auVar83,auVar76);
            auVar83 = auVar66 & auVar76;
            if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar83 >> 0x7f,0) != '\0') ||
                  (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar83 >> 0xbf,0) != '\0') ||
                (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar83[0x1f] < '\0') {
              auVar66 = vandps_avx(auVar66,auVar76);
              auVar76 = vcmpps_avx(ZEXT1632(auVar54),_DAT_02020f00,4);
              auVar83 = auVar66 & auVar76;
              if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar83 >> 0x7f,0) != '\0') ||
                    (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar83 >> 0xbf,0) != '\0') ||
                  (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar83[0x1f] < '\0') {
                auVar66 = vandps_avx(auVar76,auVar66);
                uVar103 = *(uint *)(lVar46 + -0x10 + uVar45 * 4);
                local_2bc0 = (undefined1  [8])(context->scene->geometries).items[uVar103].ptr;
                _auStack_2bb8 = auVar78._8_24_;
                uVar104 = ((Geometry *)local_2bc0)->mask;
                auVar52._4_4_ = uVar104;
                auVar52._0_4_ = uVar104;
                auVar52._8_4_ = uVar104;
                auVar52._12_4_ = uVar104;
                auVar52._16_4_ = uVar104;
                auVar52._20_4_ = uVar104;
                auVar52._24_4_ = uVar104;
                auVar52._28_4_ = uVar104;
                auVar76 = vpand_avx2(auVar52,*(undefined1 (*) [32])(ray + 0x120));
                auVar78 = vpcmpeqd_avx2(auVar76,_DAT_02020f00);
                auVar76 = auVar66 & ~auVar78;
                if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar76 >> 0x7f,0) != '\0') ||
                      (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar76 >> 0xbf,0) != '\0') ||
                    (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar76[0x1f] < '\0') {
                  uVar1 = *(undefined4 *)(lVar46 + uVar45 * 4);
                  auVar66 = vandnps_avx(auVar78,auVar66);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (((Geometry *)local_2bc0)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar76 = vrcpps_avx(auVar77);
                    auVar97._8_4_ = 0x3f800000;
                    auVar97._0_8_ = &DAT_3f8000003f800000;
                    auVar97._12_4_ = 0x3f800000;
                    auVar97._16_4_ = 0x3f800000;
                    auVar97._20_4_ = 0x3f800000;
                    auVar97._24_4_ = 0x3f800000;
                    auVar97._28_4_ = 0x3f800000;
                    auVar54 = vfnmadd213ps_fma(auVar77,auVar76,auVar97);
                    auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar76,auVar76);
                    fVar69 = auVar54._0_4_;
                    fVar72 = auVar54._4_4_;
                    auVar27._4_4_ = fVar72 * auVar81._4_4_;
                    auVar27._0_4_ = fVar69 * auVar81._0_4_;
                    fVar73 = auVar54._8_4_;
                    auVar27._8_4_ = fVar73 * auVar81._8_4_;
                    fVar74 = auVar54._12_4_;
                    auVar27._12_4_ = fVar74 * auVar81._12_4_;
                    auVar27._16_4_ = fVar68 * 0.0;
                    auVar27._20_4_ = fVar71 * 0.0;
                    auVar27._24_4_ = fVar112 * 0.0;
                    auVar27._28_4_ = auVar76._28_4_;
                    auVar76 = vminps_avx(auVar27,auVar97);
                    auVar28._4_4_ = fVar72 * auVar93._4_4_;
                    auVar28._0_4_ = fVar69 * auVar93._0_4_;
                    auVar28._8_4_ = fVar73 * auVar93._8_4_;
                    auVar28._12_4_ = fVar74 * auVar93._12_4_;
                    auVar28._16_4_ = fVar68 * 0.0;
                    auVar28._20_4_ = fVar71 * 0.0;
                    auVar28._24_4_ = fVar112 * 0.0;
                    auVar28._28_4_ = uVar47;
                    auVar77 = vminps_avx(auVar28,auVar97);
                    auVar78 = vsubps_avx(auVar97,auVar76);
                    auVar83 = vsubps_avx(auVar97,auVar77);
                    auVar31._8_8_ = uStack_2918;
                    auVar31._0_8_ = local_2920;
                    auVar31._16_8_ = uStack_2910;
                    auVar31._24_8_ = uStack_2908;
                    local_29e0 = vblendvps_avx(auVar76,auVar78,auVar31);
                    local_29c0 = vblendvps_avx(auVar77,auVar83,auVar31);
                    pRVar4 = context->user;
                    local_2980._4_4_ = uVar103;
                    local_2980._0_4_ = uVar103;
                    local_2980._8_4_ = uVar103;
                    local_2980._12_4_ = uVar103;
                    local_2980._16_4_ = uVar103;
                    local_2980._20_4_ = uVar103;
                    local_2980._24_4_ = uVar103;
                    local_2980._28_4_ = uVar103;
                    local_29a0._4_4_ = uVar1;
                    local_29a0._0_4_ = uVar1;
                    local_29a0._8_4_ = uVar1;
                    local_29a0._12_4_ = uVar1;
                    local_29a0._16_4_ = uVar1;
                    local_29a0._20_4_ = uVar1;
                    local_29a0._24_4_ = uVar1;
                    local_29a0._28_4_ = uVar1;
                    local_2a20 = ZEXT1632(auVar13);
                    local_2a00 = ZEXT1632(auVar14);
                    auVar76 = vpcmpeqd_avx2(local_29e0,local_29e0);
                    local_2c18[1] = auVar76;
                    *local_2c18 = auVar76;
                    local_2960 = pRVar4->instID[0];
                    local_2940 = pRVar4->instPrimID[0];
                    auVar29._4_4_ = fVar72 * auVar87._4_4_;
                    auVar29._0_4_ = fVar69 * auVar87._0_4_;
                    auVar29._8_4_ = fVar73 * auVar87._8_4_;
                    auVar29._12_4_ = fVar74 * auVar87._12_4_;
                    auVar29._16_4_ = fVar68 * 0.0;
                    auVar29._20_4_ = fVar71 * 0.0;
                    auVar29._24_4_ = fVar112 * 0.0;
                    auVar29._28_4_ = 0;
                    auVar76 = vblendvps_avx(_local_2b40,auVar29,auVar66);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar76;
                    local_2c10.valid = (int *)local_2ba0;
                    local_2c10.geometryUserPtr = ((Geometry *)local_2bc0)->userPtr;
                    local_2c10.context = context->user;
                    local_2c10.hit = local_2a40;
                    local_2c10.N = 8;
                    local_2c10.ray = (RTCRayN *)ray;
                    local_2ba0 = auVar66;
                    local_2a40 = (RTCHitN  [32])auVar64;
                    uStack_295c = local_2960;
                    uStack_2958 = local_2960;
                    uStack_2954 = local_2960;
                    uStack_2950 = local_2960;
                    uStack_294c = local_2960;
                    uStack_2948 = local_2960;
                    uStack_2944 = local_2960;
                    uStack_293c = local_2940;
                    uStack_2938 = local_2940;
                    uStack_2934 = local_2940;
                    uStack_2930 = local_2940;
                    uStack_292c = local_2940;
                    uStack_2928 = local_2940;
                    uStack_2924 = local_2940;
                    if (((Geometry *)local_2bc0)->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar55 = ZEXT1632(auVar55._0_16_);
                      (*((Geometry *)local_2bc0)->occlusionFilterN)(&local_2c10);
                    }
                    auVar66 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2ba0);
                    auVar76 = _DAT_0205a980 & ~auVar66;
                    if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar76 >> 0x7f,0) == '\0') &&
                          (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar76 >> 0xbf,0) == '\0') &&
                        (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar76[0x1f]) {
                      auVar66 = auVar66 ^ _DAT_0205a980;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_2bc0 + 0x3e) & 0x40) != 0)))) {
                        auVar55 = ZEXT1632(auVar55._0_16_);
                        (*p_Var5)(&local_2c10);
                      }
                      auVar76 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2ba0)
                      ;
                      auVar66 = auVar76 ^ _DAT_0205a980;
                      auVar60._8_4_ = 0xff800000;
                      auVar60._0_8_ = 0xff800000ff800000;
                      auVar60._12_4_ = 0xff800000;
                      auVar60._16_4_ = 0xff800000;
                      auVar60._20_4_ = 0xff800000;
                      auVar60._24_4_ = 0xff800000;
                      auVar60._28_4_ = 0xff800000;
                      auVar76 = vblendvps_avx(auVar60,*(undefined1 (*) [32])(local_2c10.ray + 0x100)
                                              ,auVar76);
                      *(undefined1 (*) [32])(local_2c10.ray + 0x100) = auVar76;
                    }
                    auVar76 = vblendvps_avx(_local_2b40,*(undefined1 (*) [32])local_2c48,auVar66);
                    *(undefined1 (*) [32])local_2c48 = auVar76;
                  }
                  local_2c40._0_32_ = vandnps_avx(auVar66,local_2c40._0_32_);
                }
              }
            }
          }
          auVar66 = vpcmpeqd_avx2(auVar55,auVar55);
          uVar48 = local_2c80._0_8_;
        }
        auVar108 = ZEXT3264(auVar66);
        auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar114 = ZEXT3264(local_2ca0);
        auVar116 = ZEXT3264(local_2c40._0_32_);
        bVar49 = (((((((local_2c40._0_32_ >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      || (local_2c40._0_32_ >> 0x3f & (undefined1  [32])0x1) !=
                         (undefined1  [32])0x0) ||
                     (local_2c40._0_32_ >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                    || SUB321(local_2c40._0_32_ >> 0x7f,0) != '\0') ||
                   (local_2c40._0_32_ & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_2c40._0_32_ >> 0xbf,0) != '\0') ||
                 (local_2c40._0_32_ & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_2c40[0x1f] < '\0';
      }
      auVar55 = auVar114._0_32_;
      auVar66 = auVar116._0_32_;
      if ((!bVar49) || (bVar49 = 2 < uVar45, uVar45 = uVar45 + 1, bVar49)) break;
    }
    local_2ca0 = vandps_avx(auVar66,auVar55);
    auVar55 = auVar55 & auVar66;
    if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar55 >> 0x7f,0) == '\0') &&
          (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar55 >> 0xbf,0) == '\0') &&
        (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar55[0x1f])
    break;
  }
  auVar53._0_4_ = auVar108._0_4_ ^ local_2ca0._0_4_;
  auVar53._4_4_ = auVar108._4_4_ ^ local_2ca0._4_4_;
  auVar53._8_4_ = auVar108._8_4_ ^ local_2ca0._8_4_;
  auVar53._12_4_ = auVar108._12_4_ ^ local_2ca0._12_4_;
  auVar53._16_4_ = auVar108._16_4_ ^ local_2ca0._16_4_;
  auVar53._20_4_ = auVar108._20_4_ ^ local_2ca0._20_4_;
  auVar53._24_4_ = auVar108._24_4_ ^ local_2ca0._24_4_;
  auVar53._28_4_ = auVar108._28_4_ ^ local_2ca0._28_4_;
LAB_005b5b39:
  local_2b20 = vorps_avx(auVar53,local_2b20);
  auVar66 = auVar108._0_32_ & ~local_2b20;
  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar66 >> 0x7f,0) == '\0') &&
        (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar66 >> 0xbf,0) == '\0') &&
      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar66[0x1f]) {
LAB_005b5b77:
    iVar39 = 3;
  }
  else {
    auVar65._8_4_ = 0xff800000;
    auVar65._0_8_ = 0xff800000ff800000;
    auVar65._12_4_ = 0xff800000;
    auVar65._16_4_ = 0xff800000;
    auVar65._20_4_ = 0xff800000;
    auVar65._24_4_ = 0xff800000;
    auVar65._28_4_ = 0xff800000;
    local_2640 = vblendvps_avx(local_2640,auVar65,local_2b20);
    iVar39 = 0;
  }
LAB_005b5b7a:
  if (iVar39 == 3) {
    auVar66 = vandps_avx(local_28e0,local_2b20);
    auVar61._8_4_ = 0xff800000;
    auVar61._0_8_ = 0xff800000ff800000;
    auVar61._12_4_ = 0xff800000;
    auVar61._16_4_ = 0xff800000;
    auVar61._20_4_ = 0xff800000;
    auVar61._24_4_ = 0xff800000;
    auVar61._28_4_ = 0xff800000;
    auVar66 = vmaskmovps_avx(auVar66,auVar61);
    *(undefined1 (*) [32])local_2c48 = auVar66;
    return;
  }
  goto LAB_005b4d58;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }